

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O0

void __thiscall Camera::updateCameraVectors(Camera *this)

{
  vec<3,_float,_(glm::qualifier)0> *in_RDI;
  float fVar1;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  vec<3,_float,_(glm::qualifier)0> vVar2;
  vec3 front;
  vec<3,_float,_(glm::qualifier)0> *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined8 local_70;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_68;
  undefined8 local_30;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_28;
  
  fVar1 = glm::radians<float>(in_RDI[5].field_0.x);
  std::cos((double)CONCAT44(extraout_XMM0_Db,fVar1));
  fVar1 = glm::radians<float>(in_RDI[5].field_1.y);
  std::cos((double)CONCAT44(extraout_XMM0_Db_00,fVar1));
  fVar1 = glm::radians<float>(in_RDI[5].field_1.y);
  std::sin((double)CONCAT44(extraout_XMM0_Db_01,fVar1));
  fVar1 = glm::radians<float>(in_RDI[5].field_0.x);
  std::sin((double)CONCAT44(extraout_XMM0_Db_02,fVar1));
  fVar1 = glm::radians<float>(in_RDI[5].field_1.y);
  std::cos((double)CONCAT44(extraout_XMM0_Db_03,fVar1));
  vVar2 = glm::normalize<3,float,(glm::qualifier)0>(in_RDI);
  local_28 = vVar2.field_2;
  local_30 = vVar2._0_8_;
  in_RDI[1].field_2 = local_28;
  in_RDI[1].field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(undefined4)local_30;
  in_RDI[1].field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_30._4_4_
  ;
  glm::cross<float,(glm::qualifier)0>
            ((vec<3,_float,_(glm::qualifier)0> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),in_stack_ffffffffffffff58
            );
  vVar2 = glm::normalize<3,float,(glm::qualifier)0>(in_RDI);
  local_68 = vVar2.field_2;
  local_70 = vVar2._0_8_;
  in_RDI[3].field_2 = local_68;
  in_RDI[3].field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(undefined4)local_70;
  in_RDI[3].field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_70._4_4_
  ;
  glm::cross<float,(glm::qualifier)0>
            ((vec<3,_float,_(glm::qualifier)0> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),in_stack_ffffffffffffff58
            );
  vVar2 = glm::normalize<3,float,(glm::qualifier)0>(in_RDI);
  in_RDI[2].field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)vVar2._0_8_;
  in_RDI[2].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
       (int)((ulong)vVar2._0_8_ >> 0x20);
  in_RDI[2].field_2 = vVar2.field_2;
  return;
}

Assistant:

void Camera::updateCameraVectors() {
    vec3 front;
    front.x = cos(radians(Yaw)) * cos(radians(Pitch));
    front.y = sin(radians(Pitch));
    front.z = sin(radians(Yaw)) * cos(radians(Pitch));

    Front = normalize(front);

    Right = normalize(cross(Front, WorldUp));
    Up = normalize((cross(Right, Front)));
}